

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalForcesContIntPreInt
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ChVectorDynamic<> *pCVar8;
  double *pdVar9;
  void *pvVar10;
  ulong uVar11;
  undefined8 *puVar12;
  Index outer_1;
  double *pdVar13;
  char *__function;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>
  *pCVar14;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>
  *a_lhs;
  long lVar15;
  Index outer;
  long lVar16;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebar;
  Matrix3xN ebardot;
  MatrixNxN K1_matrix;
  MatrixNxN PI1_matrix;
  add_assign_op<double,_double> local_49c1;
  ChVectorDynamic<> *local_49c0;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_> local_49b8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>_> local_49b0;
  Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_> local_49a8;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  local_49a0;
  Matrix<double,_32,_3,_1,_32,_3> local_4980;
  Matrix3xN local_4680;
  Matrix3xN local_4380;
  Matrix<double,_32,_32,_0,_32,_32> local_4080;
  Matrix<double,_32,_32,_1,_32,_32> local_2080;
  
  local_49c0 = Fi;
  CalcCoordMatrix(this,&local_4680);
  CalcCoordDerivMatrix(this,&local_4380);
  a_lhs = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>
           *)&local_4080;
  local_4080.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>.m_storage.m_data.array
  [2] = 0.5;
  local_4080.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>.m_storage.m_data.array
  [3] = (double)&local_4680;
  local_4080.super_PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>.m_storage.m_data.array
  [5] = (double)&local_4680;
  memset(&local_2080,0,0x2000);
  local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,3,0,32,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,32,1,3,32>>const>,Eigen::Matrix<double,3,32,1,3,32>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,32,32,1,32,32>>
            (&local_2080,a_lhs,&local_4680,(Scalar *)&local_4980);
  if (this->m_damping_enabled == true) {
    local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data.array
    [2] = this->m_Alpha;
    lVar15 = 0;
    local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data.array
    [3] = (double)&local_4380;
    local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data.array
    [5] = (double)&local_4680;
    memset(&local_4080,0,0x2000);
    local_49a0.m_dst = (DstEvaluatorType *)0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,32,3,0,32,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,32,1,3,32>>const>,Eigen::Matrix<double,3,32,1,3,32>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,32,32,0,32,32>>
              (&local_4080,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>
                *)&local_4980,&local_4680,(Scalar *)&local_49a0);
    local_49a0.m_src = (SrcEvaluatorType *)&local_49b0;
    local_49b0.m_d.data = (plainobjectbase_evaluator_data<double,_32>)&local_4080;
    local_49a0.m_dst = (DstEvaluatorType *)&local_49b8;
    local_49b8.m_d.data = (plainobjectbase_evaluator_data<double,_32>)&local_2080;
    lVar16 = 0;
    local_49a0.m_functor = &local_49c1;
    local_49a0.m_dstExpr = (DstXprType *)local_49b8.m_d.data;
    do {
      pdVar13 = ((local_49a0.m_src)->
                super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>_>)
                .m_d.data;
      pdVar9 = ((local_49a0.m_dst)->
               super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>_>).
               m_d.data;
      *(double *)((long)pdVar9 + lVar15) = pdVar13[lVar16] + *(double *)((long)pdVar9 + lVar15);
      *(double *)((long)pdVar9 + lVar15 + 8) =
           pdVar13[lVar16 + 0x20] + *(double *)((long)pdVar9 + lVar15 + 8);
      *(double *)((long)pdVar9 + lVar15 + 0x10) =
           pdVar13[lVar16 + 0x40] + *(double *)((long)pdVar9 + lVar15 + 0x10);
      *(double *)((long)pdVar9 + lVar15 + 0x18) =
           pdVar13[lVar16 + 0x60] + *(double *)((long)pdVar9 + lVar15 + 0x18);
      *(double *)((long)pdVar9 + lVar15 + 0x20) =
           pdVar13[lVar16 + 0x80] + *(double *)((long)pdVar9 + lVar15 + 0x20);
      *(double *)((long)pdVar9 + lVar15 + 0x28) =
           pdVar13[lVar16 + 0xa0] + *(double *)((long)pdVar9 + lVar15 + 0x28);
      Eigen::internal::
      copy_using_evaluator_DefaultTraversal_InnerUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_1,_32,_32>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_32,_32,_0,_32,_32>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_6,_32>
      ::run(&local_49a0,lVar16);
      lVar16 = lVar16 + 1;
      lVar15 = lVar15 + 0x100;
    } while (lVar16 != 0x20);
  }
  local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data.array
  [1] = (double)&local_2080;
  local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.m_data.array
  [0] = (double)&this->m_O1;
  local_49a0.m_dst = (DstEvaluatorType *)a_lhs;
  if ((this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x400) {
    Eigen::internal::
    Assignment<Eigen::Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Map<Eigen::Matrix<double,_1024,_1,_0,_1024,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_49a0,
          (SrcXprType *)&local_4980,(assign_op<double,_double> *)&local_49b0);
    if (((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows != 0x20) ||
       ((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != 0x20)) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 32, 32, 1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 32, 32, 1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    pdVar13 = (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    this_00 = &this->m_K13Compact;
    if ((((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows != 0x20) ||
        ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_cols != 0x20)) &&
       ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                   ((DenseStorage<double,__1,__1,__1,_0> *)this_00,0x400,0x20,0x20),
        (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_rows != 0x20 ||
        ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_cols != 0x20)))) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 32, 32, 1>, const Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
                   );
    }
    pdVar9 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar15 = 0;
    do {
      lVar16 = 0;
      pCVar14 = a_lhs;
      do {
        dVar1 = *(double *)pCVar14;
        pCVar14 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>
                   *)&pCVar14[6].m_lhs.m_functor;
        pdVar9[lVar16] = dVar1 - pdVar13[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x20);
      lVar15 = lVar15 + 1;
      pdVar13 = pdVar13 + 0x20;
      a_lhs = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_32,_3,_0,_32,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_32,_1,_3,_32>_>_>
               *)&a_lhs->m_lhs;
      pdVar9 = pdVar9 + 0x20;
    } while (lVar15 != 0x20);
    if ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols == 0x20) {
      local_49b0.m_d.data =
           (plainobjectbase_evaluator_data<double,_32>)
           (plainobjectbase_evaluator_data<double,_32>)this_00;
      local_49a8.m_matrix = &local_4680;
      memset(&local_4980,0,0x300);
      local_49b8.m_d.data = (plainobjectbase_evaluator_data<double,_32>)(double *)0x3ff0000000000000
      ;
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,3,32,1,3,32>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,32,3,1,32,3>>
                (&local_4980,this_00,&local_49a8,(Scalar *)&local_49b8);
      pCVar8 = local_49c0;
      pdVar13 = (local_49c0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_data;
      if ((local_49c0->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows != 0x60) {
        if (pdVar13 != (double *)0x0) {
          free((void *)pdVar13[-1]);
        }
        pvVar10 = malloc(0x340);
        if (pvVar10 == (void *)0x0) {
          puVar12 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar12 = std::ostream::_M_insert<bool>;
          __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        *(void **)(((ulong)pvVar10 & 0xffffffffffffffc0) + 0x38) = pvVar10;
        pdVar13 = (double *)(((ulong)pvVar10 & 0xffffffffffffffc0) + 0x40);
        (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             pdVar13;
        (pCVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
             0x60;
      }
      uVar11 = 0xfffffffffffffff8;
      do {
        dVar1 = local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
                m_data.array[uVar11 + 9];
        dVar2 = local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
                m_data.array[uVar11 + 10];
        dVar3 = local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
                m_data.array[uVar11 + 0xb];
        dVar4 = local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
                m_data.array[uVar11 + 0xc];
        dVar5 = local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
                m_data.array[uVar11 + 0xd];
        dVar6 = local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
                m_data.array[uVar11 + 0xe];
        dVar7 = local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.m_storage.
                m_data.array[uVar11 + 0xf];
        pdVar9 = pdVar13 + uVar11 + 8;
        *pdVar9 = local_4980.super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_1,_32,_3>_>.
                  m_storage.m_data.array[uVar11 + 8];
        pdVar9[1] = dVar1;
        pdVar9[2] = dVar2;
        pdVar9[3] = dVar3;
        pdVar9[4] = dVar4;
        pdVar9[5] = dVar5;
        pdVar9[6] = dVar6;
        pdVar9[7] = dVar7;
        uVar11 = uVar11 + 8;
      } while (uVar11 < 0x58);
      return;
    }
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Transpose<Eigen::Matrix<double, 3, 32, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 32, 1>>, Option = 0]"
    ;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Map<Eigen::Matrix<double, 1024, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Map<Eigen::Matrix<double, 1024, 1>>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.  For this method, the in-simulation calculations are independent of
    // the number of Gauss quadrature points used throughout the entire element.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}